

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall
helics::CommonCore::sendCommand
          (CommonCore *this,string_view target,string_view commandStr,string_view source,
          HelicsSequencingModes mode)

{
  FederateState *pFVar1;
  atomic<helics::GlobalBrokerId> *paVar2;
  size_t size;
  action_t startingAction;
  byte *__src;
  size_type __rlen;
  string_view str;
  long *local_108 [2];
  long local_f8 [2];
  ActionMessage local_e8;
  
  __src = (byte *)commandStr._M_str;
  size = commandStr._M_len;
  if ((size == 5) && (__src[4] == 0x68 && *(undefined4 *)__src == 0x73756c66)) {
    (*(this->super_Core)._vptr_Core[0x5e])
              (local_108,this,target._M_len,target._M_str,0xc,"global_flush",1);
    if (local_108[0] == local_f8) {
      return;
    }
    operator_delete(local_108[0],local_f8[0] + 1);
    return;
  }
  startingAction = cmd_send_command;
  if (mode == HELICS_SEQUENCING_MODE_ORDERED) {
    startingAction = cmd_send_command_ordered;
  }
  ActionMessage::ActionMessage(&local_e8,startingAction);
  local_e8.dest_id.gid = 0;
  local_e8.payload.bufferSize = size;
  if ((local_e8.payload.heap != __src) && (SmallBuffer::reserve(&local_e8.payload,size), size != 0))
  {
    memcpy(local_e8.payload.heap,__src,size);
  }
  ActionMessage::setString(&local_e8,0,target);
  if (source._M_len == 0) {
    str._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
    str._M_len = (this->super_BrokerBase).identifier._M_string_length;
    ActionMessage::setString(&local_e8,1,str);
    paVar2 = &(this->super_BrokerBase).global_id;
  }
  else {
    ActionMessage::setString(&local_e8,1,source);
    pFVar1 = getFederate(this,source);
    if (pFVar1 == (FederateState *)0x0) goto LAB_002f1b37;
    paVar2 = (atomic<helics::GlobalBrokerId> *)&pFVar1->global_id;
  }
  local_e8.source_id.gid = (((atomic<helics::GlobalFederateId> *)paVar2)->_M_i).gid;
LAB_002f1b37:
  BrokerBase::addActionMessage(&this->super_BrokerBase,&local_e8);
  ActionMessage::~ActionMessage(&local_e8);
  return;
}

Assistant:

void CommonCore::sendCommand(std::string_view target,
                             std::string_view commandStr,
                             std::string_view source,
                             HelicsSequencingModes mode)
{
    if (commandStr == "flush") {
        query(target, "global_flush", HelicsSequencingModes::HELICS_SEQUENCING_MODE_ORDERED);
        return;
    }
    ActionMessage cmdcmd(mode == HelicsSequencingModes::HELICS_SEQUENCING_MODE_ORDERED ?
                             CMD_SEND_COMMAND_ORDERED :
                             CMD_SEND_COMMAND);
    cmdcmd.dest_id = parent_broker_id;
    cmdcmd.payload = commandStr;
    cmdcmd.setString(targetStringLoc, target);
    if (!source.empty()) {
        cmdcmd.setString(sourceStringLoc, source);
        const auto* fed = getFederate(source);
        if (fed != nullptr) {
            cmdcmd.source_id = fed->global_id;
        }
    } else {
        cmdcmd.setString(sourceStringLoc, getIdentifier());
        cmdcmd.source_id = getGlobalId();
    }
    addActionMessage(std::move(cmdcmd));
}